

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O2

IAnimatedMesh * __thiscall
irr::scene::COBJMeshFileLoader::createMesh(COBJMeshFileLoader *this,IReadFile *file)

{
  undefined1 *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double __x;
  char cVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  u32 uVar10;
  undefined4 extraout_var;
  SObjMtl *pSVar11;
  undefined4 extraout_var_00;
  COBJMeshFileLoader *__s;
  long *plVar12;
  COBJMeshFileLoader *inBuf;
  _Alloc_hider buf;
  iterator iVar13;
  SMesh *this_01;
  SAnimatedMesh *this_02;
  long lVar14;
  uint number;
  char *pcVar15;
  stringc *this_03;
  COBJMeshFileLoader *this_04;
  array<irr::core::vector3d<float>_> *this_05;
  c8 *bufEnd;
  ulong uVar16;
  ulong uVar17;
  COBJMeshFileLoader *bufEnd_00;
  bool bVar18;
  u32 m;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float fVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar21;
  undefined4 uVar22;
  SObjMtl *currMtl;
  int vertLocation;
  s32 Idx [3];
  undefined1 local_398 [28];
  vector2df local_37c;
  array<int> faceCorners;
  array<irr::core::vector2d<float>_> textureCoordBuffer;
  array<irr::core::vector3d<float>_> normalsBuffer;
  array<irr::core::vector3d<float>_> vertexBuffer;
  stringc wordBuffer;
  stringc mtlName;
  stringc grpName;
  stringc TAG_OFF;
  path fullName;
  c8 name [512];
  
  if (file == (IReadFile *)0x0) {
    return (IAnimatedMesh *)0x0;
  }
  iVar9 = (*file->_vptr_IReadFile[2])(file);
  lVar14 = CONCAT44(extraout_var,iVar9);
  this_02 = (SAnimatedMesh *)0x0;
  if (lVar14 != 0) {
    core::array<irr::core::vector3d<float>_>::array(&vertexBuffer,1000);
    core::array<irr::core::vector3d<float>_>::array(&normalsBuffer,1000);
    core::array<irr::core::vector2d<float>_>::array(&textureCoordBuffer,1000);
    pSVar11 = (SObjMtl *)operator_new(0x80);
    SObjMtl::SObjMtl(pSVar11);
    this_00 = &(this->super_IMeshLoader).field_0x10;
    currMtl = pSVar11;
    core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
              ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)this_00,&currMtl);
    iVar9 = (*file->_vptr_IReadFile[4])(file);
    core::string<char>::string(&fullName,(string<char> *)CONCAT44(extraout_var_00,iVar9));
    __s = (COBJMeshFileLoader *)operator_new__(lVar14 + 1U);
    memset(__s,0,lVar14 + 1U);
    (**file->_vptr_IReadFile)(file,__s,lVar14);
    bufEnd_00 = (COBJMeshFileLoader *)
                ((long)&(((stl_type *)&__s->super_IMeshLoader)->_M_dataplus)._M_p + lVar14);
    grpName.str._M_dataplus._M_p = (pointer)&grpName.str.field_2;
    grpName.str._M_string_length = 0;
    mtlName.str._M_dataplus._M_p = (pointer)&mtlName.str.field_2;
    mtlName.str._M_string_length = 0;
    grpName.str.field_2._M_local_buf[0] = '\0';
    number = 0;
    mtlName.str.field_2._M_local_buf[0] = '\0';
    plVar12 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xd8))();
    cVar6 = (**(code **)(*plVar12 + 0x98))(plVar12,"OBJ_IgnoreGroups",0);
    plVar12 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xd8))();
    cVar7 = (**(code **)(*plVar12 + 0x98))(plVar12,"OBJ_IgnoreMaterialFiles",0);
    faceCorners.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    faceCorners.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    faceCorners.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    faceCorners.is_sorted = true;
    core::array<int>::reallocate(&faceCorners,0x20,true);
    pcVar15 = "off";
    core::string<char>::string<char>(&TAG_OFF,"off");
    bVar18 = false;
    inBuf = __s;
    while (inBuf != bufEnd_00) {
      cVar1 = *(char *)&(((stl_type *)&inBuf->super_IMeshLoader)->_M_dataplus)._M_p;
      switch(cVar1) {
      case 'm':
        if (cVar7 == '\0') {
          inBuf = (COBJMeshFileLoader *)
                  goAndCopyNextWord(this,name,(c8 *)inBuf,0x200,(c8 *)bufEnd_00);
        }
        break;
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 't':
        break;
      case 's':
        inBuf = (COBJMeshFileLoader *)goAndCopyNextWord(this,name,(c8 *)inBuf,0x200,(c8 *)bufEnd_00)
        ;
        bVar8 = core::string<char>::operator==(&TAG_OFF,name);
        if (!bVar8) {
          core::strtoul10(name,(char **)0x0);
        }
        break;
      case 'u':
        pcVar15 = name;
        inBuf = (COBJMeshFileLoader *)
                goAndCopyNextWord(this,pcVar15,(c8 *)inBuf,0x200,(c8 *)bufEnd_00);
        this_03 = &mtlName;
LAB_001d9380:
        core::string<char>::operator=(this_03,pcVar15);
LAB_001d9385:
        bVar18 = true;
        break;
      case 'v':
        cVar1 = *(char *)((long)&(((stl_type *)&inBuf->super_IMeshLoader)->_M_dataplus)._M_p + 1);
        if (cVar1 == 't') {
          name[0] = '\0';
          name[1] = '\0';
          name[2] = '\0';
          name[3] = '\0';
          name[4] = '\0';
          name[5] = '\0';
          name[6] = '\0';
          name[7] = '\0';
          inBuf = (COBJMeshFileLoader *)
                  readUV(this,(c8 *)inBuf,(vector2d<float> *)name,(c8 *)bufEnd_00);
          core::array<irr::core::vector2d<float>_>::push_back
                    (&textureCoordBuffer,(vector2d<float> *)name);
        }
        else {
          if (cVar1 == 'n') {
            name[0] = '\0';
            name[1] = '\0';
            name[2] = '\0';
            name[3] = '\0';
            name[4] = '\0';
            name[5] = '\0';
            name[6] = '\0';
            name[7] = '\0';
            name[8] = '\0';
            name[9] = '\0';
            name[10] = '\0';
            name[0xb] = '\0';
            inBuf = (COBJMeshFileLoader *)
                    readVec3(this,(c8 *)inBuf,(vector3df *)name,(c8 *)bufEnd_00);
            this_05 = &normalsBuffer;
          }
          else {
            if (cVar1 != ' ') break;
            name[0] = '\0';
            name[1] = '\0';
            name[2] = '\0';
            name[3] = '\0';
            name[4] = '\0';
            name[5] = '\0';
            name[6] = '\0';
            name[7] = '\0';
            name[8] = '\0';
            name[9] = '\0';
            name[10] = '\0';
            name[0xb] = '\0';
            inBuf = (COBJMeshFileLoader *)
                    readVec3(this,(c8 *)inBuf,(vector3df *)name,(c8 *)bufEnd_00);
            this_05 = &vertexBuffer;
          }
          core::array<irr::core::vector3d<float>_>::push_back(this_05,(vector3d<float> *)name);
        }
        break;
      default:
        if (cVar1 == 'f') {
          local_398._16_4_ = 0.0;
          local_398._20_4_ = 0.0;
          local_398._0_8_ = (pointer)0x0;
          local_398._8_4_ = 0.0;
          local_398._12_4_ = 0.0;
          local_398._24_4_ = 0xffffffff;
          local_37c.X = 0.0;
          local_37c.Y = 0.0;
          if (bVar18) {
            pcVar15 = (char *)&mtlName;
            pSVar11 = findMtl(this,(stringc *)pcVar15,&grpName);
            if (pSVar11 == (SObjMtl *)0x0) goto LAB_001d93d0;
LAB_001d93da:
            currMtl = pSVar11;
            local_398._24_4_ = (currMtl->Meshbuffer->Material).DiffuseColor.color;
          }
          else {
LAB_001d93d0:
            pSVar11 = currMtl;
            if (currMtl != (SObjMtl *)0x0) goto LAB_001d93da;
          }
          copyLine(&wordBuffer,(COBJMeshFileLoader *)pcVar15,(c8 *)inBuf,(c8 *)bufEnd_00);
          buf = wordBuffer.str._M_dataplus;
          bufEnd = wordBuffer.str._M_dataplus._M_p + (uint)wordBuffer.str._M_string_length;
          ::std::vector<int,_std::allocator<int>_>::resize(&faceCorners.m_data,0);
          while (this_04 = this, buf._M_p = goNextWord(this,buf._M_p,bufEnd,true), *buf._M_p != '\0'
                ) {
            Idx[2] = -1;
            Idx[0] = -1;
            Idx[1] = -1;
            uVar10 = copyWord(this_04,name,buf._M_p,0x200,bufEnd);
            retrieveVertexIndices
                      (this,name,Idx,name + (ulong)uVar10 + 1,
                       (u32)(((long)vertexBuffer.m_data.
                                    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vertexBuffer.m_data.
                                   super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc),
                       (u32)((ulong)((long)textureCoordBuffer.m_data.
                                           super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)textureCoordBuffer.m_data.
                                          super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),
                       (u32)(((long)normalsBuffer.m_data.
                                    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)normalsBuffer.m_data.
                                   super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc));
            lVar14 = (long)Idx[0];
            uVar20 = extraout_XMM0_Da_00;
            uVar22 = extraout_XMM0_Db_00;
            if ((lVar14 < 0) ||
               ((int)(((long)vertexBuffer.m_data.
                             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertexBuffer.m_data.
                            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= Idx[0]))
            goto LAB_001d9652;
            local_398._8_4_ =
                 vertexBuffer.m_data.
                 super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14].Z;
            local_398._0_8_ =
                 *(undefined8 *)
                  (vertexBuffer.m_data.
                   super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar14);
            fVar19 = 0.0;
            fVar21 = 0.0;
            if ((-1 < (long)Idx[1]) &&
               (Idx[1] < (int)((ulong)((long)textureCoordBuffer.m_data.
                                             super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)textureCoordBuffer.m_data.
                                            super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
              fVar19 = textureCoordBuffer.m_data.
                       super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[Idx[1]].X;
              fVar21 = textureCoordBuffer.m_data.
                       super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[Idx[1]].Y;
            }
            local_37c.Y = fVar21;
            local_37c.X = fVar19;
            lVar14 = (long)Idx[2];
            if ((lVar14 < 0) ||
               ((int)(((long)normalsBuffer.m_data.
                             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)normalsBuffer.m_data.
                            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= Idx[2])) {
              local_398._12_4_ = 0.0;
              local_398._16_4_ = 0.0;
              local_398._20_4_ = 0.0;
              currMtl->RecalculateNormals = true;
            }
            else {
              local_398._20_4_ =
                   normalsBuffer.m_data.
                   super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14].Z;
              uVar4 = normalsBuffer.m_data.
                      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar14].X;
              uVar5 = normalsBuffer.m_data.
                      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar14].Y;
              local_398._12_4_ = uVar4;
              local_398._16_4_ = uVar5;
            }
            iVar13 = ::std::
                     _Rb_tree<irr::video::S3DVertex,_std::pair<const_irr::video::S3DVertex,_int>,_std::_Select1st<std::pair<const_irr::video::S3DVertex,_int>_>,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                     ::find((_Rb_tree<irr::video::S3DVertex,_std::pair<const_irr::video::S3DVertex,_int>,_std::_Select1st<std::pair<const_irr::video::S3DVertex,_int>_>,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                             *)currMtl,(key_type *)local_398);
            if ((_Rb_tree_header *)iVar13._M_node ==
                &(currMtl->VertMap)._M_t._M_impl.super__Rb_tree_header) {
              core::array<irr::video::S3DVertex>::push_back
                        (&currMtl->Meshbuffer->Vertices,(key_type *)local_398);
              vertLocation = (int)(((long)(currMtl->Meshbuffer->Vertices).m_data.
                                          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(currMtl->Meshbuffer->Vertices).m_data.
                                         super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x24) + -1;
              ::std::
              _Rb_tree<irr::video::S3DVertex,std::pair<irr::video::S3DVertex_const,int>,std::_Select1st<std::pair<irr::video::S3DVertex_const,int>>,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
              ::_M_emplace_unique<irr::video::S3DVertex&,int&>
                        ((_Rb_tree<irr::video::S3DVertex,std::pair<irr::video::S3DVertex_const,int>,std::_Select1st<std::pair<irr::video::S3DVertex_const,int>>,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
                          *)currMtl,(key_type *)local_398,&vertLocation);
            }
            else {
              vertLocation = *(int *)&iVar13._M_node[2].field_0x4;
            }
            core::array<int>::push_back(&faceCorners,&vertLocation);
          }
          uVar20 = extraout_XMM0_Da;
          uVar22 = extraout_XMM0_Db;
          if (2 < (uint)((ulong)((long)faceCorners.m_data.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)faceCorners.m_data.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2)) {
            iVar9 = *faceCorners.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar16 = 1;
            do {
              uVar17 = uVar16;
              while( true ) {
                uVar16 = uVar17 + 1;
                if ((int)((ulong)((long)faceCorners.m_data.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)faceCorners.m_data.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2) - 1 <= uVar17) {
                  bVar8 = true;
                  goto LAB_001d966e;
                }
                iVar2 = faceCorners.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar17];
                iVar3 = faceCorners.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
                if (((iVar3 != iVar2) && (iVar3 != iVar9)) && (iVar2 != iVar9)) break;
                number = number + 1;
                uVar17 = uVar16;
              }
              Idx[0]._0_2_ = (short)iVar3;
              core::array<unsigned_short>::push_back
                        (&currMtl->Meshbuffer->Indices,(unsigned_short *)Idx);
              Idx[0]._0_2_ = (undefined2)iVar2;
              core::array<unsigned_short>::push_back
                        (&currMtl->Meshbuffer->Indices,(unsigned_short *)Idx);
              Idx[0]._0_2_ = (short)iVar9;
              core::array<unsigned_short>::push_back
                        (&currMtl->Meshbuffer->Indices,(unsigned_short *)Idx);
            } while( true );
          }
LAB_001d9652:
          os::Printer::log((double)CONCAT44(uVar22,uVar20));
          operator_delete__(__s);
          cleanUp(this);
          bVar8 = false;
LAB_001d966e:
          ::std::__cxx11::string::_M_dispose();
          bVar18 = false;
          if (!bVar8) {
            this_02 = (SAnimatedMesh *)0x0;
            goto LAB_001d9956;
          }
        }
        else if (cVar1 == 'g') {
          inBuf = (COBJMeshFileLoader *)
                  goAndCopyNextWord(this,name,(c8 *)inBuf,0x200,(c8 *)bufEnd_00);
          if (cVar6 == '\0') {
            pcVar15 = name;
            if (name[0] == '\0') {
              pcVar15 = "default";
            }
            this_03 = &grpName;
            goto LAB_001d9380;
          }
          goto LAB_001d9385;
        }
      }
      pcVar15 = (char *)inBuf;
      inBuf = (COBJMeshFileLoader *)goNextLine(this,pcVar15,(c8 *)bufEnd_00);
    }
    if (number != 0) {
      core::string<char>::string((string<char> *)name,number);
      core::string<char>::operator+=((string<char> *)name," degenerated faces removed in ");
      core::string<char>::string((string<char> *)local_398,&fullName);
      ::std::__cxx11::string::append((string *)name);
      __x = (double)::std::__cxx11::string::_M_dispose();
      os::Printer::log((Printer *)name._0_8_,__x);
      ::std::__cxx11::string::_M_dispose();
    }
    this_01 = (SMesh *)operator_new(0x58);
    SMesh::SMesh(this_01);
    for (uVar16 = 0; lVar14 = *(long *)&(this->super_IMeshLoader).field_0x10,
        uVar16 < ((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar14) >> 3 & 0xffffffff
                 ); uVar16 = uVar16 + 1) {
      iVar9 = (**(code **)(**(long **)(*(long *)(lVar14 + uVar16 * 8) + 0x30) + 0x48))();
      if (iVar9 != 0) {
        (**(code **)(**(long **)(*(long *)(*(long *)this_00 + uVar16 * 8) + 0x30) + 0x60))();
        lVar14 = *(long *)(*(long *)this_00 + uVar16 * 8);
        if (*(char *)(lVar14 + 0x7d) == '\x01') {
          plVar12 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xb8))();
          (**(code **)(*plVar12 + 8))
                    (plVar12,*(undefined8 *)
                              (*(long *)(*(long *)&(this->super_IMeshLoader).field_0x10 + uVar16 * 8
                                        ) + 0x30),0,0);
          lVar14 = *(long *)(*(long *)&(this->super_IMeshLoader).field_0x10 + uVar16 * 8);
        }
        SMesh::addMeshBuffer(this_01,*(IMeshBuffer **)(lVar14 + 0x30));
      }
    }
    iVar9 = (**(this_01->super_IMesh)._vptr_IMesh)(this_01);
    if (iVar9 == 0) {
      this_02 = (SAnimatedMesh *)0x0;
    }
    else {
      SMesh::recalculateBoundingBox(this_01);
      this_02 = (SAnimatedMesh *)operator_new(0x60);
      SAnimatedMesh::SAnimatedMesh(this_02,(IMesh *)0x0,EAMT_UNKNOWN);
      this_02->Type = EAMT_OBJ;
      SAnimatedMesh::addMesh(this_02,(IMesh *)this_01);
      SAnimatedMesh::recalculateBoundingBox(this_02);
    }
    operator_delete__(__s);
    cleanUp(this);
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(this_01->super_IMesh)._vptr_IMesh +
               (long)(this_01->super_IMesh)._vptr_IMesh[-3]));
LAB_001d9956:
    ::std::__cxx11::string::_M_dispose();
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&faceCorners);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::_Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>::
    ~_Vector_base((_Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                   *)&textureCoordBuffer);
    ::std::_Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
    ~_Vector_base((_Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                   *)&normalsBuffer);
    ::std::_Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
    ~_Vector_base((_Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                   *)&vertexBuffer);
  }
  return (IAnimatedMesh *)this_02;
}

Assistant:

IAnimatedMesh *COBJMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	const long filesize = file->getSize();
	if (!filesize)
		return 0;

	const u32 WORD_BUFFER_LENGTH = 512;

	core::array<core::vector3df> vertexBuffer(1000);
	core::array<core::vector3df> normalsBuffer(1000);
	core::array<core::vector2df> textureCoordBuffer(1000);

	SObjMtl *currMtl = new SObjMtl();
	Materials.push_back(currMtl);
	u32 smoothingGroup = 0;

	const io::path fullName = file->getFileName();

	c8 *buf = new c8[filesize + 1]; // plus null-terminator
	memset(buf, 0, filesize + 1);
	file->read((void *)buf, filesize);
	const c8 *const bufEnd = buf + filesize;

	// Process obj information
	const c8 *bufPtr = buf;
	core::stringc grpName, mtlName;
	bool mtlChanged = false;
	bool useGroups = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_GROUPS);
	bool useMaterials = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_MATERIAL_FILES);
	[[maybe_unused]] irr::u32 lineNr = 1; // only counts non-empty lines, still useful in debugging to locate errors
	core::array<int> faceCorners;
	faceCorners.reallocate(32); // should be large enough
	const core::stringc TAG_OFF = "off";
	irr::u32 degeneratedFaces = 0;

	while (bufPtr != bufEnd) {
		switch (bufPtr[0]) {
		case 'm': // mtllib (material)
		{
			if (useMaterials) {
				c8 name[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(name, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Ignoring material file", name);
#endif
			}
		} break;

		case 'v': // v, vn, vt
			switch (bufPtr[1]) {
			case ' ': // vertex
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				vertexBuffer.push_back(vec);
			} break;

			case 'n': // normal
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				normalsBuffer.push_back(vec);
			} break;

			case 't': // texcoord
			{
				core::vector2df vec;
				bufPtr = readUV(bufPtr, vec, bufEnd);
				textureCoordBuffer.push_back(vec);
			} break;
			}
			break;

		case 'g': // group name
		{
			c8 grp[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(grp, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded group start", grp, ELL_DEBUG);
#endif
			if (useGroups) {
				if (0 != grp[0])
					grpName = grp;
				else
					grpName = "default";
			}
			mtlChanged = true;
		} break;

		case 's': // smoothing can be a group or off (equiv. to 0)
		{
			c8 smooth[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(smooth, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded smoothing group start", smooth, ELL_DEBUG);
#endif
			if (TAG_OFF == smooth)
				smoothingGroup = 0;
			else
				smoothingGroup = core::strtoul10(smooth);

			(void)smoothingGroup; // disable unused variable warnings
		} break;

		case 'u': // usemtl
			// get name of material
			{
				c8 matName[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(matName, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Loaded material start", matName, ELL_DEBUG);
#endif
				mtlName = matName;
				mtlChanged = true;
			}
			break;

		case 'f': // face
		{
			c8 vertexWord[WORD_BUFFER_LENGTH]; // for retrieving vertex data
			video::S3DVertex v;
			// Assign vertex color from currently active material's diffuse color
			if (mtlChanged) {
				// retrieve the material
				SObjMtl *useMtl = findMtl(mtlName, grpName);
				// only change material if we found it
				if (useMtl)
					currMtl = useMtl;
				mtlChanged = false;
			}
			if (currMtl)
				v.Color = currMtl->Meshbuffer->Material.DiffuseColor;

			// get all vertices data in this face (current line of obj file)
			const core::stringc wordBuffer = copyLine(bufPtr, bufEnd);
			const c8 *linePtr = wordBuffer.c_str();
			const c8 *const endPtr = linePtr + wordBuffer.size();

			faceCorners.set_used(0); // fast clear

			// read in all vertices
			linePtr = goNextWord(linePtr, endPtr);
			while (0 != linePtr[0]) {
				// Array to communicate with retrieveVertexIndices()
				// sends the buffer sizes and gets the actual indices
				// if index not set returns -1
				s32 Idx[3];
				Idx[0] = Idx[1] = Idx[2] = -1;

				// read in next vertex's data
				u32 wlength = copyWord(vertexWord, linePtr, WORD_BUFFER_LENGTH, endPtr);
				// this function will also convert obj's 1-based index to c++'s 0-based index
				retrieveVertexIndices(vertexWord, Idx, vertexWord + wlength + 1, vertexBuffer.size(), textureCoordBuffer.size(), normalsBuffer.size());
				if (Idx[0] >= 0 && Idx[0] < (irr::s32)vertexBuffer.size())
					v.Pos = vertexBuffer[Idx[0]];
				else {
					os::Printer::log("Invalid vertex index in this line", wordBuffer.c_str(), ELL_ERROR);
					delete[] buf;
					cleanUp();
					return 0;
				}
				if (Idx[1] >= 0 && Idx[1] < (irr::s32)textureCoordBuffer.size())
					v.TCoords = textureCoordBuffer[Idx[1]];
				else
					v.TCoords.set(0.0f, 0.0f);
				if (Idx[2] >= 0 && Idx[2] < (irr::s32)normalsBuffer.size())
					v.Normal = normalsBuffer[Idx[2]];
				else {
					v.Normal.set(0.0f, 0.0f, 0.0f);
					currMtl->RecalculateNormals = true;
				}

				int vertLocation;
				auto n = currMtl->VertMap.find(v);
				if (n != currMtl->VertMap.end()) {
					vertLocation = n->second;
				} else {
					currMtl->Meshbuffer->Vertices.push_back(v);
					vertLocation = currMtl->Meshbuffer->Vertices.size() - 1;
					currMtl->VertMap.emplace(v, vertLocation);
				}

				faceCorners.push_back(vertLocation);

				// go to next vertex
				linePtr = goNextWord(linePtr, endPtr);
			}

			if (faceCorners.size() < 3) {
				os::Printer::log("Too few vertices in this line", wordBuffer.c_str(), ELL_ERROR);
				delete[] buf;
				cleanUp();
				return 0;
			}

			// triangulate the face
			const int c = faceCorners[0];
			for (u32 i = 1; i < faceCorners.size() - 1; ++i) {
				// Add a triangle
				const int a = faceCorners[i + 1];
				const int b = faceCorners[i];
				if (a != b && a != c && b != c) { // ignore degenerated faces. We can get them when we merge vertices above in the VertMap.
					currMtl->Meshbuffer->Indices.push_back(a);
					currMtl->Meshbuffer->Indices.push_back(b);
					currMtl->Meshbuffer->Indices.push_back(c);
				} else {
					++degeneratedFaces;
				}
			}
		} break;

		case '#': // comment
		default:
			break;
		} // end switch(bufPtr[0])
		// eat up rest of line
		bufPtr = goNextLine(bufPtr, bufEnd);
		++lineNr;
	} // end while(bufPtr && (bufPtr-buf<filesize))

	if (degeneratedFaces > 0) {
		irr::core::stringc log(degeneratedFaces);
		log += " degenerated faces removed in ";
		log += irr::core::stringc(fullName);
		os::Printer::log(log.c_str(), ELL_INFORMATION);
	}

	SMesh *mesh = new SMesh();

	// Combine all the groups (meshbuffers) into the mesh
	for (u32 m = 0; m < Materials.size(); ++m) {
		if (Materials[m]->Meshbuffer->getIndexCount() > 0) {
			Materials[m]->Meshbuffer->recalculateBoundingBox();
			if (Materials[m]->RecalculateNormals)
				SceneManager->getMeshManipulator()->recalculateNormals(Materials[m]->Meshbuffer);
			mesh->addMeshBuffer(Materials[m]->Meshbuffer);
		}
	}

	// Create the Animated mesh if there's anything in the mesh
	SAnimatedMesh *animMesh = 0;
	if (0 != mesh->getMeshBufferCount()) {
		mesh->recalculateBoundingBox();
		animMesh = new SAnimatedMesh();
		animMesh->Type = EAMT_OBJ;
		animMesh->addMesh(mesh);
		animMesh->recalculateBoundingBox();
	}

	// Clean up the allocate obj file contents
	delete[] buf;
	// more cleaning up
	cleanUp();
	mesh->drop();

	return animMesh;
}